

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Subpackage * __thiscall
google::protobuf::DescriptorPool::Tables::Allocate<google::protobuf::Symbol::Subpackage>
          (Tables *this)

{
  Subpackage *__s;
  Tables *this_local;
  
  __s = (Subpackage *)AllocateBytes(this,0x10);
  memset(__s,0,1);
  __s->name_size = 0;
  __s->file = (FileDescriptor *)0x0;
  return __s;
}

Assistant:

Type* DescriptorPool::Tables::Allocate() {
  static_assert(std::is_trivially_destructible<Type>::value, "");
  static_assert(alignof(Type) <= 8, "");
  return ::new (AllocateBytes(sizeof(Type))) Type{};
}